

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

bool __thiscall libcellml::Generator::GeneratorImpl::modifiedProfile(GeneratorImpl *this)

{
  Profile PVar1;
  int iVar2;
  GeneratorProfilePtr *in_RDX;
  string profileContents;
  string local_50;
  string local_30;
  
  generatorProfileAsString_abi_cxx11_(&local_30,(libcellml *)&this->mProfile,in_RDX);
  PVar1 = GeneratorProfile::profile
                    ((this->mProfile).
                     super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (PVar1 == C) {
    sha1(&local_50,&local_30);
  }
  else {
    sha1(&local_50,&local_30);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar2 != 0;
}

Assistant:

bool Generator::GeneratorImpl::modifiedProfile() const
{
    std::string profileContents = generatorProfileAsString(mProfile);

    return (mProfile->profile() == GeneratorProfile::Profile::C) ?
               sha1(profileContents) != C_GENERATOR_PROFILE_SHA1 :
               sha1(profileContents) != PYTHON_GENERATOR_PROFILE_SHA1;
}